

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_aggregate_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::PerfectAggregateHashTable::Scan
          (PerfectAggregateHashTable *this,idx_t *scan_position,DataChunk *result)

{
  data_ptr_t pdVar1;
  byte bVar2;
  value_type vVar3;
  PerfectAggregateHashTable *pPVar4;
  DataChunk *result_00;
  vector<unsigned_long,_true> *this_00;
  uint8_t uVar5;
  int8_t iVar6;
  uint16_t uVar7;
  int16_t iVar8;
  uint uVar9;
  uint32_t uVar10;
  int32_t iVar11;
  reference pvVar12;
  reference this_01;
  reference vector;
  int64_t iVar13;
  uint64_t uVar14;
  type layout;
  InternalException *this_02;
  idx_t iVar15;
  idx_t i;
  idx_t iVar16;
  uint uVar17;
  ulong __n;
  idx_t iVar18;
  allocator local_2089;
  Vector *local_2088;
  PerfectAggregateHashTable *local_2080;
  DataChunk *local_2078;
  vector<duckdb::Value,_true> *local_2070;
  vector<unsigned_long,_true> *local_2068;
  ulong local_2060;
  RowOperationsState row_state;
  uint32_t group_values [2048];
  
  pdVar1 = (this->addresses).data;
  iVar15 = *scan_position;
  iVar18 = 0;
  do {
    if (this->total_groups <= iVar15) {
      if (iVar18 != 0) {
LAB_0195af33:
        iVar15 = this->total_required_bits;
        local_2068 = &this->required_bits;
        local_2070 = &this->group_minima;
        __n = 0;
        local_2088 = &this->addresses;
        local_2080 = this;
        local_2078 = result;
        while (this_00 = local_2068, result_00 = local_2078, pPVar4 = local_2080,
              __n < local_2080->grouping_columns) {
          pvVar12 = vector<unsigned_long,_true>::get<true>(local_2068,__n);
          iVar15 = iVar15 - *pvVar12;
          this_01 = vector<duckdb::Value,_true>::get<true>(local_2070,__n);
          pvVar12 = vector<unsigned_long,_true>::get<true>(this_00,__n);
          vVar3 = *pvVar12;
          local_2060 = __n;
          vector = vector<duckdb::Vector,_true>::get<true>(&result_00->data,__n);
          uVar9 = (uint)(vector->type).physical_type_;
          if (7 < uVar9 - 2) {
            this_02 = (InternalException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&row_state,"Invalid type for perfect aggregate HT group",
                       &local_2089);
            InternalException::InternalException(this_02,(string *)&row_state);
            __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          uVar17 = ~(uint)(-1L << ((byte)vVar3 & 0x3f));
          bVar2 = (byte)iVar15;
          switch(uVar9) {
          case 2:
            pdVar1 = vector->data;
            FlatVector::VerifyFlatVector(vector);
            uVar5 = Value::GetValueUnsafe<unsigned_char>(this_01);
            for (iVar16 = 0; iVar18 != iVar16; iVar16 = iVar16 + 1) {
              uVar9 = group_values[iVar16] >> (bVar2 & 0x1f) & uVar17;
              if (uVar9 == 0) {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar16);
              }
              else {
                pdVar1[iVar16] = (char)uVar9 + uVar5 + 0xff;
              }
            }
            break;
          case 3:
            pdVar1 = vector->data;
            FlatVector::VerifyFlatVector(vector);
            iVar6 = Value::GetValueUnsafe<signed_char>(this_01);
            for (iVar16 = 0; iVar18 != iVar16; iVar16 = iVar16 + 1) {
              uVar9 = group_values[iVar16] >> (bVar2 & 0x1f) & uVar17;
              if (uVar9 == 0) {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar16);
              }
              else {
                pdVar1[iVar16] = (char)uVar9 + iVar6 + -1;
              }
            }
            break;
          case 4:
            pdVar1 = vector->data;
            FlatVector::VerifyFlatVector(vector);
            uVar7 = Value::GetValueUnsafe<unsigned_short>(this_01);
            for (iVar16 = 0; iVar18 != iVar16; iVar16 = iVar16 + 1) {
              uVar9 = group_values[iVar16] >> (bVar2 & 0x1f) & uVar17;
              if (uVar9 == 0) {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar16);
              }
              else {
                *(uint16_t *)(pdVar1 + iVar16 * 2) = (short)uVar9 + (uVar7 - 1);
              }
            }
            break;
          case 5:
            pdVar1 = vector->data;
            FlatVector::VerifyFlatVector(vector);
            iVar8 = Value::GetValueUnsafe<short>(this_01);
            for (iVar16 = 0; iVar18 != iVar16; iVar16 = iVar16 + 1) {
              uVar9 = group_values[iVar16] >> (bVar2 & 0x1f) & uVar17;
              if (uVar9 == 0) {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar16);
              }
              else {
                *(short *)(pdVar1 + iVar16 * 2) = (short)uVar9 + iVar8 + -1;
              }
            }
            break;
          case 6:
            pdVar1 = vector->data;
            FlatVector::VerifyFlatVector(vector);
            uVar10 = Value::GetValueUnsafe<unsigned_int>(this_01);
            for (iVar16 = 0; iVar18 != iVar16; iVar16 = iVar16 + 1) {
              uVar9 = group_values[iVar16] >> (bVar2 & 0x1f) & uVar17;
              if (uVar9 == 0) {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar16);
              }
              else {
                *(uint *)(pdVar1 + iVar16 * 4) = uVar9 + (uVar10 - 1);
              }
            }
            break;
          case 7:
            pdVar1 = vector->data;
            FlatVector::VerifyFlatVector(vector);
            iVar11 = Value::GetValueUnsafe<int>(this_01);
            for (iVar16 = 0; iVar18 != iVar16; iVar16 = iVar16 + 1) {
              uVar9 = group_values[iVar16] >> (bVar2 & 0x1f) & uVar17;
              if (uVar9 == 0) {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar16);
              }
              else {
                *(uint *)(pdVar1 + iVar16 * 4) = uVar9 + iVar11 + -1;
              }
            }
            break;
          case 8:
            pdVar1 = vector->data;
            FlatVector::VerifyFlatVector(vector);
            uVar14 = Value::GetValueUnsafe<unsigned_long>(this_01);
            for (iVar16 = 0; iVar18 != iVar16; iVar16 = iVar16 + 1) {
              uVar9 = group_values[iVar16] >> (bVar2 & 0x1f) & uVar17;
              if (uVar9 == 0) {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar16);
              }
              else {
                *(uint64_t *)(pdVar1 + iVar16 * 8) = (long)(int)uVar9 + (uVar14 - 1);
              }
            }
            break;
          case 9:
            pdVar1 = vector->data;
            FlatVector::VerifyFlatVector(vector);
            iVar13 = Value::GetValueUnsafe<long>(this_01);
            for (iVar16 = 0; iVar18 != iVar16; iVar16 = iVar16 + 1) {
              uVar9 = group_values[iVar16] >> (bVar2 & 0x1f) & uVar17;
              if (uVar9 == 0) {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar16);
              }
              else {
                *(long *)(pdVar1 + iVar16 * 8) = (long)(int)uVar9 + iVar13 + -1;
              }
            }
          }
          __n = local_2060 + 1;
        }
        local_2078->count = iVar18;
        row_state.allocator =
             unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>::
             operator*(&local_2080->aggregate_allocator);
        row_state.addresses.super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>.
        _M_t.super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
        super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)
             (__uniq_ptr_data<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true,_true>)0x0;
        layout = shared_ptr<duckdb::TupleDataLayout,_true>::operator*
                           (&(pPVar4->super_BaseAggregateHashTable).layout_ptr);
        RowOperations::FinalizeStates
                  (&row_state,layout,local_2088,result_00,pPVar4->grouping_columns);
        ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
                  (&row_state.addresses.
                    super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>);
      }
      return;
    }
    if ((this->group_is_set).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
        super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
        super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
        super__Head_base<0UL,_bool_*,_false>._M_head_impl[iVar15] == true) {
      *(data_ptr_t *)(pdVar1 + iVar18 * 8) = this->data + this->tuple_size * iVar15;
      uVar9 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(iVar15);
      group_values[iVar18] = uVar9;
      iVar18 = iVar18 + 1;
      iVar15 = *scan_position;
      if (iVar18 == 0x800) {
        *scan_position = iVar15 + 1;
        iVar18 = 0x800;
        goto LAB_0195af33;
      }
    }
    iVar15 = iVar15 + 1;
    *scan_position = iVar15;
  } while( true );
}

Assistant:

void PerfectAggregateHashTable::Scan(idx_t &scan_position, DataChunk &result) {
	auto data_pointers = FlatVector::GetData<data_ptr_t>(addresses);
	uint32_t group_values[STANDARD_VECTOR_SIZE];

	// iterate over the HT until we either have exhausted the entire HT, or
	idx_t entry_count = 0;
	for (; scan_position < total_groups; scan_position++) {
		if (group_is_set[scan_position]) {
			// this group is set: add it to the set of groups to extract
			data_pointers[entry_count] = data + tuple_size * scan_position;
			group_values[entry_count] = NumericCast<uint32_t>(scan_position);
			entry_count++;
			if (entry_count == STANDARD_VECTOR_SIZE) {
				scan_position++;
				break;
			}
		}
	}
	if (entry_count == 0) {
		// no entries found
		return;
	}
	// first reconstruct the groups from the group index
	idx_t shift = total_required_bits;
	for (idx_t i = 0; i < grouping_columns; i++) {
		shift -= required_bits[i];
		ReconstructGroupVector(group_values, group_minima[i], required_bits[i], shift, entry_count, result.data[i]);
	}
	// then construct the payloads
	result.SetCardinality(entry_count);
	RowOperationsState row_state(*aggregate_allocator);
	RowOperations::FinalizeStates(row_state, *layout_ptr, addresses, result, grouping_columns);
}